

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

void anon_unknown.dwarf_9fd58::AddErrorInfoWithLocation
               (ExpressionContext *ctx,SmallArray<ErrorInfo_*,_4U> *errorList,SynBase *source,
               char *messageStart,char *messageEnd)

{
  uint uVar1;
  Allocator *pAVar2;
  char *__s;
  Lexeme *pLVar3;
  Lexeme *pLVar4;
  int iVar5;
  undefined4 extraout_var;
  char *pcVar7;
  size_t sVar8;
  ModuleData *pMVar9;
  ErrorInfo *pEVar6;
  
  iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
  pEVar6 = (ErrorInfo *)CONCAT44(extraout_var,iVar5);
  pAVar2 = ctx->allocator;
  pLVar3 = source->begin;
  pLVar4 = source->end;
  pcVar7 = (source->pos).begin;
  pEVar6->messageStart = messageStart;
  pEVar6->messageEnd = messageEnd;
  pEVar6->begin = pLVar3;
  pEVar6->end = pLVar4;
  pEVar6->pos = pcVar7;
  (pEVar6->related).allocator = pAVar2;
  (pEVar6->related).data = (pEVar6->related).little;
  (pEVar6->related).count = 0;
  (pEVar6->related).max = 4;
  pEVar6->parentModule = (ModuleData *)0x0;
  if (errorList->count == errorList->max) {
    SmallArray<ErrorInfo_*,_4U>::grow(errorList,errorList->count);
  }
  if (errorList->data != (ErrorInfo **)0x0) {
    uVar1 = errorList->count;
    errorList->count = uVar1 + 1;
    errorList->data[uVar1] = pEVar6;
    pcVar7 = FindModuleCodeWithSourceLocation(ctx,(source->pos).begin);
    if (pcVar7 != (char *)0x0) {
      AddErrorLocationInfo(pcVar7,(source->pos).begin,ctx->errorBuf,ctx->errorBufSize);
      __s = ctx->errorBufLocation;
      sVar8 = strlen(__s);
      ctx->errorBufLocation = __s + sVar8;
      if (pcVar7 != ctx->code) {
        pMVar9 = FindModuleWithSourceLocation(ctx,(source->pos).begin);
        if (pMVar9 != (ModuleData *)0x0) {
          NULLC::SafeSprintf(ctx->errorBufLocation,
                             (ulong)((*(int *)&ctx->errorBuf - (int)ctx->errorBufLocation) +
                                    ctx->errorBufSize)," [in module \'%.*s\']\n",
                             (ulong)(uint)(*(int *)&(pMVar9->name).end - (int)(pMVar9->name).begin))
          ;
          pcVar7 = ctx->errorBufLocation;
          sVar8 = strlen(pcVar7);
          ctx->errorBufLocation = pcVar7 + sVar8;
          if (errorList->count == 0) {
            __assert_fail("count > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                          ,0x172,"T &SmallArray<ErrorInfo *, 4>::back() [T = ErrorInfo *, N = 4]");
          }
          errorList->data[errorList->count - 1]->parentModule = pMVar9;
        }
      }
    }
    return;
  }
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x162,
                "void SmallArray<ErrorInfo *, 4>::push_back(const T &) [T = ErrorInfo *, N = 4]");
}

Assistant:

void AddErrorInfoWithLocation(ExpressionContext &ctx, SmallArray<ErrorInfo*, 4> &errorList, SynBase *source, const char *messageStart, const char *messageEnd)
	{
		errorList.push_back(new (ctx.get<ErrorInfo>()) ErrorInfo(ctx.allocator, messageStart, messageEnd, source->begin, source->end, source->pos.begin));

		if(const char *code = FindModuleCodeWithSourceLocation(ctx, source->pos.begin))
		{
			AddErrorLocationInfo(code, source->pos.begin, ctx.errorBuf, ctx.errorBufSize);

			ctx.errorBufLocation += strlen(ctx.errorBufLocation);

			if(code != ctx.code)
			{
				ModuleData *parentModule = FindModuleWithSourceLocation(ctx, source->pos.begin);

				if(parentModule)
				{
					NULLC::SafeSprintf(ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), " [in module '%.*s']\n", FMT_ISTR(parentModule->name));

					ctx.errorBufLocation += strlen(ctx.errorBufLocation);

					errorList.back()->parentModule = parentModule;
				}
			}
		}
	}